

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

string * __thiscall
flatbuffers::rust::RustGenerator::GetEnumTypeForDecl_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,Type *type)

{
  FullType FVar1;
  allocator<char> local_11;
  
  FVar1 = anon_unknown_26::GetFullType(type);
  if (FVar1 - ftEnumKey < 2) {
    if ((ulong)type->base_type == 2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"u8","");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,GetEnumTypeForDecl::ctypename[type->base_type],
                 &local_11);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("false && \"precondition failed in GetEnumTypeForDecl\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x279,
                "std::string flatbuffers::rust::RustGenerator::GetEnumTypeForDecl(const Type &)");
}

Assistant:

std::string GetEnumTypeForDecl(const Type &type) {
    const auto ft = GetFullType(type);
    if (!(ft == ftEnumKey || ft == ftUnionKey)) {
      FLATBUFFERS_ASSERT(false && "precondition failed in GetEnumTypeForDecl");
    }

    // clang-format off
    static const char *ctypename[] = {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, \
                           RTYPE, ...) \
      #RTYPE,
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    };
    // clang-format on

    // Enums can be bools, but their Rust representation must be a u8, as used
    // in the repr attribute (#[repr(bool)] is an invalid attribute).
    if (type.base_type == BASE_TYPE_BOOL) return "u8";
    return ctypename[type.base_type];
  }